

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O3

void SequenceTask::run(search *sch,multi_ex *ec)

{
  uint32_t count;
  action aVar1;
  pointer ppeVar2;
  predictor *ppVar3;
  stringstream *psVar4;
  ostream *poVar5;
  ulong uVar6;
  predictor P;
  char local_139;
  string local_138;
  predictor local_118;
  
  Search::predictor::predictor(&local_118,sch,0);
  ppeVar2 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar2) {
    uVar6 = 0;
    do {
      aVar1 = (ppeVar2[uVar6]->l).multi.label;
      ppVar3 = Search::predictor::set_tag(&local_118,(ptag)uVar6 + 1);
      ppVar3 = Search::predictor::set_input
                         (ppVar3,(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar6]);
      ppVar3 = Search::predictor::set_oracle(ppVar3,aVar1);
      count = Search::search::get_history_length(sch);
      ppVar3 = Search::predictor::set_condition_range(ppVar3,(ptag)uVar6,count,'p');
      aVar1 = Search::predictor::predict(ppVar3);
      psVar4 = Search::search::output_abi_cxx11_(sch);
      if (*(int *)(psVar4 + *(long *)(*(long *)psVar4 + -0x18) + 0x20) == 0) {
        psVar4 = Search::search::output_abi_cxx11_(sch);
        Search::search::pretty_label_abi_cxx11_(&local_138,sch,aVar1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)(psVar4 + 0x10),local_138._M_dataplus._M_p,
                            local_138._M_string_length);
        local_139 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_139,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
      }
      uVar6 = uVar6 + 1;
      ppeVar2 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3));
  }
  Search::predictor::~predictor(&local_118);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  Search::predictor P(sch, (ptag)0);
  for (size_t i = 0; i < ec.size(); i++)
  {
    action oracle = ec[i]->l.multi.label;
    size_t prediction = P.set_tag((ptag)i + 1)
                            .set_input(*ec[i])
                            .set_oracle(oracle)
                            .set_condition_range((ptag)i, sch.get_history_length(), 'p')
                            .predict();

    if (sch.output().good())
      sch.output() << sch.pretty_label((uint32_t)prediction) << ' ';
  }
}